

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall google::protobuf::DescriptorPool::Tables::FindSymbol(Tables *this,string_view key)

{
  SymbolsByNameSet *this_00;
  char *pcVar1;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  *prVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  bool bVar40;
  ushort uVar41;
  Symbol *key_1;
  MixingHashState MVar42;
  slot_type *psVar43;
  anon_union_8_1_a8a14541_for_iterator_2 aVar44;
  Symbol SVar45;
  ulong uVar46;
  slot_type *extraout_RDX;
  slot_type *extraout_RDX_00;
  slot_type *slot;
  slot_type *extraout_RDX_01;
  FullNameQuery *b;
  FullNameQuery *b_00;
  undefined1 (*unaff_RBX) [16];
  ulong uVar47;
  undefined1 *puVar48;
  ctrl_t *pcVar49;
  size_t sVar50;
  size_t cap_2;
  long lVar51;
  Symbol *key_2;
  uint uVar52;
  undefined1 uVar53;
  uint64_t v;
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i match;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  iterator iVar59;
  size_t hash_of_arg;
  FullNameQuery local_b8;
  Tables *local_a8;
  ulong local_a0;
  ctrl_t *local_98;
  anon_class_24_3_2b146c49 local_90;
  anon_class_24_3_2b146c49 local_78;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  ulong local_38;
  
  local_b8.query._M_str = key._M_str;
  sVar50 = key._M_len;
  this_00 = &this->symbols_by_name_;
  local_b8.query._M_len = sVar50;
  if (1 < (this->symbols_by_name_).
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    MVar42 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                       ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                        (uchar *)local_b8.query._M_str,sVar50);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = sVar50 + MVar42.state_;
    local_38 = SUB168(auVar55 * ZEXT816(0x9ddfea08eb382d69),8) ^
               SUB168(auVar55 * ZEXT816(0x9ddfea08eb382d69),0);
    local_90.hash_of_arg = &local_38;
    local_90.key = &local_b8;
    prVar2 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              *)(this_00->
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                ).settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.capacity_;
    local_90.this =
         &this_00->
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ;
    if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   *)0x1) {
      psVar43 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                ::soo_slot(&this_00->
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                          );
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
      anon_class_24_3_2b146c49::operator()(&local_90,(ctrl_t *)psVar43,slot);
    }
    else {
      uVar47 = local_a0;
      if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                     *)0x0) goto LAB_0020a479;
      if (prVar2 < (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    *)0x11) {
        lVar51 = *(long *)((long)&(this->symbols_by_name_).
                                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                  .settings_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                  .value.heap_or_soo_ + 8);
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        ::slot_array(prVar2);
        local_78.hash_of_arg = local_90.hash_of_arg;
        local_78.key = local_90.key;
        local_78.this = local_90.this;
        uVar47 = (this->symbols_by_name_).
                 super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        unaff_RBX = (undefined1 (*) [16])
                    (this->symbols_by_name_).
                    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control;
        local_a8 = this;
        if (uVar47 < 0xf) {
          if (8 < uVar47) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          unaff_RBX = (undefined1 (*) [16])(*(ulong *)(*unaff_RBX + uVar47) & 0x8080808080808080);
          if (unaff_RBX != (undefined1 (*) [16])0x8080808080808080) {
            uVar47 = (ulong)unaff_RBX ^ 0x8080808080808080;
            psVar43 = extraout_RDX;
            do {
              lVar5 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
              anon_class_24_3_2b146c49::operator()
                        (&local_78,(ctrl_t *)((ulong)((uint)lVar5 & 0xfffffff8) + lVar51 + -8),
                         psVar43);
              uVar47 = uVar47 & uVar47 - 1;
              psVar43 = extraout_RDX_00;
            } while (uVar47 != 0);
            unaff_RBX = (undefined1 (*) [16])0x0;
            this = local_a8;
          }
        }
        else {
          uVar47 = (this->symbols_by_name_).
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar47) {
            uVar47 = uVar47 >> 1;
            psVar43 = extraout_RDX;
            uVar46 = uVar47;
            while( true ) {
              auVar55 = *unaff_RBX;
              uVar52 = (uint)(ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar55[0xf] >> 7) << 0xf);
              if (uVar52 != 0xffff) {
                uVar52 = ~uVar52;
                do {
                  uVar4 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  if ((char)(*unaff_RBX)[uVar4] < '\0') {
                    __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x764,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                                 );
                  }
                  absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  ::AssertHashEqConsistent<google::protobuf::(anonymous_namespace)::FullNameQuery>::
                  anon_class_24_3_2b146c49::operator()
                            (&local_78,(ctrl_t *)(lVar51 + (ulong)uVar4 * 8),psVar43);
                  uVar46 = uVar46 - 1;
                  uVar41 = (ushort)(uVar52 - 1) & (ushort)uVar52;
                  uVar52 = CONCAT22((short)(uVar52 - 1 >> 0x10),uVar41);
                  psVar43 = extraout_RDX_01;
                } while (uVar41 != 0);
              }
              if (uVar46 == 0) break;
              lVar51 = lVar51 + 0x80;
              puVar48 = *unaff_RBX;
              unaff_RBX = unaff_RBX + 1;
              if (puVar48[0xf] == -1) {
                __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x76b,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
            }
            this = local_a8;
            if (uVar47 < (local_a8->symbols_by_name_).
                         super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                         .value.size_ >> 1) {
              __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x770,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          }
        }
      }
    }
  }
  prVar2 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            *)(this_00->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ).settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
  uVar47 = local_a0;
  if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 *)0x1) {
    if (1 < (this->symbols_by_name_).
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            size_) {
      psVar43 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                ::soo_slot(&this_00->
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                          );
      bVar40 = (anonymous_namespace)::SymbolByFullNameEq::operator()
                         (psVar43,(Symbol *)&local_b8,b_00);
      uVar47 = local_a0;
      if (bVar40) {
        aVar44.slot_ = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       ::soo_slot(&this_00->
                                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                 );
        iVar59.field_1.slot_ = aVar44.slot_;
        iVar59.ctrl_ = (ctrl_t *)&absl::lts_20240722::container_internal::kSooControl;
        goto LAB_0020a423;
      }
    }
  }
  else {
    if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   *)0x0) {
LAB_0020a479:
      local_a0 = uVar47;
      __assert_fail("!kEnabled || cap >= kCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb37,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                   );
    }
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::prefetch_heap_block(prVar2);
    sVar50 = local_b8.query._M_len;
    MVar42 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                       ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                        (uchar *)local_b8.query._M_str,local_b8.query._M_len);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = sVar50 + MVar42.state_;
    prVar2 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              *)(this->symbols_by_name_).
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.capacity_;
    if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   *)0x1) {
      __assert_fail("!is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdb0,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::FullNameQuery]"
                   );
    }
    uVar47 = local_a0;
    if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   *)0x0) goto LAB_0020a479;
    if (((ulong)((long)&(prVar2->settings_).
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_ + 1U) & (ulong)prVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x145,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    uVar47 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
    pcVar49 = (this->symbols_by_name_).
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.control;
    puVar48 = (undefined1 *)(uVar47 >> 7 ^ (ulong)pcVar49 >> 0xc);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::control(prVar2);
    uVar53 = (undefined1)uVar47;
    auVar55 = ZEXT216(CONCAT11(uVar53,uVar53) & 0x7f7f);
    auVar55 = pshuflw(auVar55,auVar55,0);
    uVar54 = auVar55._0_4_;
    auVar57._4_4_ = uVar54;
    auVar57._0_4_ = uVar54;
    auVar57._8_4_ = uVar54;
    auVar57._12_4_ = uVar54;
    uVar46 = 0;
    while( true ) {
      unaff_RBX = (undefined1 (*) [16])((ulong)puVar48 & (ulong)prVar2);
      pcVar1 = *unaff_RBX + (long)pcVar49;
      auVar56[0] = -(auVar57[0] == *pcVar1);
      auVar56[1] = -(auVar57[1] == pcVar1[1]);
      auVar56[2] = -(auVar57[2] == pcVar1[2]);
      auVar56[3] = -(auVar57[3] == pcVar1[3]);
      auVar56[4] = -(auVar57[4] == pcVar1[4]);
      auVar56[5] = -(auVar57[5] == pcVar1[5]);
      auVar56[6] = -(auVar57[6] == pcVar1[6]);
      auVar56[7] = -(auVar57[7] == pcVar1[7]);
      auVar56[8] = -(auVar57[8] == pcVar1[8]);
      auVar56[9] = -(auVar57[9] == pcVar1[9]);
      auVar56[10] = -(auVar57[10] == pcVar1[10]);
      auVar56[0xb] = -(auVar57[0xb] == pcVar1[0xb]);
      auVar56[0xc] = -(auVar57[0xc] == pcVar1[0xc]);
      auVar56[0xd] = -(auVar57[0xd] == pcVar1[0xd]);
      auVar56[0xe] = -(auVar57[0xe] == pcVar1[0xe]);
      auVar56[0xf] = -(auVar57[0xf] == pcVar1[0xf]);
      uVar41 = (ushort)(SUB161(auVar56 >> 7,0) & 1) | (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe | (ushort)(auVar56[0xf] >> 7) << 0xf;
      uVar52 = (uint)uVar41;
      cVar24 = *pcVar1;
      cVar25 = pcVar1[1];
      cVar26 = pcVar1[2];
      cVar27 = pcVar1[3];
      cVar28 = pcVar1[4];
      cVar29 = pcVar1[5];
      cVar30 = pcVar1[6];
      cVar31 = pcVar1[7];
      cVar32 = pcVar1[8];
      cVar33 = pcVar1[9];
      cVar34 = pcVar1[10];
      cVar35 = pcVar1[0xb];
      cVar36 = pcVar1[0xc];
      cVar37 = pcVar1[0xd];
      cVar38 = pcVar1[0xe];
      cVar39 = pcVar1[0xf];
      uVar47 = local_a0;
      cVar8 = local_58;
      cVar9 = cStack_57;
      cVar10 = cStack_56;
      cVar11 = cStack_55;
      cVar12 = cStack_54;
      cVar13 = cStack_53;
      cVar14 = cStack_52;
      cVar15 = cStack_51;
      cVar16 = cStack_50;
      cVar17 = cStack_4f;
      cVar18 = cStack_4e;
      cVar19 = cStack_4d;
      cVar20 = cStack_4c;
      cVar21 = cStack_4b;
      cVar22 = cStack_4a;
      cVar23 = cStack_49;
      while (cStack_49 = cVar39, cStack_4a = cVar38, cStack_4b = cVar37, cStack_4c = cVar36,
            cStack_4d = cVar35, cStack_4e = cVar34, cStack_4f = cVar33, cStack_50 = cVar32,
            cStack_51 = cVar31, cStack_52 = cVar30, cStack_53 = cVar29, cStack_54 = cVar28,
            cStack_55 = cVar27, cStack_56 = cVar26, cStack_57 = cVar25, local_58 = cVar24,
            local_a0 = uVar46, uVar41 != 0) {
        uVar4 = 0;
        if (uVar52 != 0) {
          for (; (uVar52 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar47 = (ulong)(*unaff_RBX + uVar4) & (ulong)prVar2;
        lVar51 = *(long *)((long)&(this->symbols_by_name_).
                                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                  .settings_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                  .value.heap_or_soo_ + 8);
        local_98 = pcVar49;
        local_48 = auVar57;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      *)(this->symbols_by_name_).
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_);
        bVar40 = (anonymous_namespace)::SymbolByFullNameEq::operator()
                           ((void *)(uVar47 * 8 + lVar51),(Symbol *)&local_b8,b);
        if (bVar40) {
          iVar59 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at(&this_00->
                                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                 ,uVar47);
          goto LAB_0020a423;
        }
        uVar41 = (ushort)(uVar52 - 1) & (ushort)uVar52;
        uVar52 = CONCAT22((short)(uVar52 - 1 >> 0x10),uVar41);
        uVar46 = local_a0;
        pcVar49 = local_98;
        auVar57 = local_48;
        cVar24 = local_58;
        cVar25 = cStack_57;
        cVar26 = cStack_56;
        cVar27 = cStack_55;
        cVar28 = cStack_54;
        cVar29 = cStack_53;
        cVar30 = cStack_52;
        cVar31 = cStack_51;
        cVar32 = cStack_50;
        cVar33 = cStack_4f;
        cVar34 = cStack_4e;
        cVar35 = cStack_4d;
        cVar36 = cStack_4c;
        cVar37 = cStack_4b;
        cVar38 = cStack_4a;
        cVar39 = cStack_49;
        uVar47 = local_a0;
        cVar8 = local_58;
        cVar9 = cStack_57;
        cVar10 = cStack_56;
        cVar11 = cStack_55;
        cVar12 = cStack_54;
        cVar13 = cStack_53;
        cVar14 = cStack_52;
        cVar15 = cStack_51;
        cVar16 = cStack_50;
        cVar17 = cStack_4f;
        cVar18 = cStack_4e;
        cVar19 = cStack_4d;
        cVar20 = cStack_4c;
        cVar21 = cStack_4b;
        cVar22 = cStack_4a;
        cVar23 = cStack_49;
      }
      auVar58[0] = -(local_58 == -0x80);
      auVar58[1] = -(cStack_57 == -0x80);
      auVar58[2] = -(cStack_56 == -0x80);
      auVar58[3] = -(cStack_55 == -0x80);
      auVar58[4] = -(cStack_54 == -0x80);
      auVar58[5] = -(cStack_53 == -0x80);
      auVar58[6] = -(cStack_52 == -0x80);
      auVar58[7] = -(cStack_51 == -0x80);
      auVar58[8] = -(cStack_50 == -0x80);
      auVar58[9] = -(cStack_4f == -0x80);
      auVar58[10] = -(cStack_4e == -0x80);
      auVar58[0xb] = -(cStack_4d == -0x80);
      auVar58[0xc] = -(cStack_4c == -0x80);
      auVar58[0xd] = -(cStack_4b == -0x80);
      auVar58[0xe] = -(cStack_4a == -0x80);
      bVar40 = cStack_49 == -0x80;
      auVar58[0xf] = -bVar40;
      local_58 = cVar8;
      cStack_57 = cVar9;
      cStack_56 = cVar10;
      cStack_55 = cVar11;
      cStack_54 = cVar12;
      cStack_53 = cVar13;
      cStack_52 = cVar14;
      cStack_51 = cVar15;
      cStack_50 = cVar16;
      cStack_4f = cVar17;
      cStack_4e = cVar18;
      cStack_4d = cVar19;
      cStack_4c = cVar20;
      cStack_4b = cVar21;
      cStack_4a = cVar22;
      cStack_49 = cVar23;
      if ((((((((((((((((auVar58 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar58 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar58 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar58 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar58 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar58 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar58 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar58 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar58 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar58 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar58 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar58 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar40) break;
      uVar3 = (this_00->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ).settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
      if (uVar3 == 0) goto LAB_0020a479;
      puVar48 = unaff_RBX[1] + local_a0;
      uVar46 = local_a0 + 0x10;
      local_a0 = uVar47;
      if (uVar3 < uVar46) {
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xdbd,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::FullNameQuery]"
                     );
      }
    }
  }
  local_a0 = uVar47;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = unaff_RBX;
  iVar59 = (iterator)(auVar7 << 0x40);
LAB_0020a423:
  bVar40 = absl::lts_20240722::container_internal::operator==
                     ((iterator *)iVar59.ctrl_,(iterator *)iVar59.field_1.slot_);
  if (bVar40) {
    SVar45.ptr_ = (SymbolBase *)&Symbol::Symbol()::null_symbol;
  }
  else {
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::iterator::operator*((iterator *)iVar59.ctrl_);
    SVar45.ptr_ = (iVar59.field_1.slot_)->ptr_;
  }
  return (Symbol)SVar45.ptr_;
}

Assistant:

inline Symbol DescriptorPool::Tables::FindSymbol(absl::string_view key) const {
  auto it = symbols_by_name_.find(FullNameQuery{key});
  return it == symbols_by_name_.end() ? Symbol() : *it;
}